

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiNavItemData *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_000000bc;
  ImRect *in_stack_000000c0;
  ImGuiWindow *in_stack_000000c8;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((((pIVar1->Appearing & 1U) != 0) && (GImGui->NavWindow == pIVar1->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || ((GImGui->NavInitResult).ID != 0)))) &&
     (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    NavApplyItemToResult(unaff_retaddr);
    NavUpdateAnyRequestFlag();
    bVar3 = ImRect::Contains(&pIVar1->ClipRect,&(pIVar2->LastItemData).Rect);
    if (!bVar3) {
      ScrollToRectEx(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResult.ID == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    NavApplyItemToResult(&g.NavInitResult);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via an opt-in flag (we however don't want regular init requests to scroll)
    if (!window->ClipRect.Contains(g.LastItemData.Rect))
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}